

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_unit.c
# Opt level: O2

void to_uint32_array_test(void)

{
  int iVar1;
  int iVar2;
  run_container_t *run;
  void *vout;
  size_t offset;
  ulong uVar3;
  int k;
  uint uVar4;
  long lVar5;
  
  for (uVar3 = 1; uVar3 < 0x80; uVar3 = uVar3 * 2) {
    run = run_container_create();
    _assert_true((unsigned_long)run,"B",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
                 ,0x83);
    for (uVar4 = 0; uVar4 < 0x10000; uVar4 = uVar4 + (int)uVar3) {
      run_container_add(run,(uint16_t)uVar4);
    }
    iVar1 = run_container_cardinality(run);
    vout = malloc((long)iVar1 * 4);
    iVar2 = run_container_to_uint32_array(vout,run,0);
    _assert_int_equal((long)iVar2,(long)iVar1,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
                      ,0x8c);
    for (lVar5 = 1; lVar5 < iVar2; lVar5 = lVar5 + 1) {
      _assert_int_equal((ulong)*(uint *)((long)vout + lVar5 * 4),
                        *(uint *)((long)vout + lVar5 * 4 + -4) + uVar3,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
                        ,0x8f);
    }
    free(vout);
    run_container_free(run);
  }
  return;
}

Assistant:

DEFINE_TEST(to_uint32_array_test) {
    for (size_t offset = 1; offset < 128; offset *= 2) {
        run_container_t* B = run_container_create();
        assert_non_null(B);

        for (int k = 0; k < (1 << 16); k += offset) {
            run_container_add(B, k);
        }

        int card = run_container_cardinality(B);
        uint32_t* out = (uint32_t*)malloc(sizeof(uint32_t) * card);
        int nc = run_container_to_uint32_array(out, B, 0);
        assert_int_equal(nc, card);

        for (int k = 1; k < nc; ++k) {
            assert_int_equal(out[k], offset + out[k - 1]);
        }

        free(out);
        run_container_free(B);
    }
}